

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O1

string * YAML::ErrorMsg::BAD_SUBSCRIPT_WITH_KEY(string *__return_storage_ptr__,string *key)

{
  ostream *poVar1;
  stringstream stream;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"operator[] call on a scalar",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(local_190," (key: \"",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(key->_M_dataplus)._M_p,key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline const std::string BAD_SUBSCRIPT_WITH_KEY(const std::string& key) {
  std::stringstream stream;
  stream << BAD_SUBSCRIPT << " (key: \"" << key << "\")";
  return stream.str();
}